

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddConvexPolyFilled(ImDrawList *this,ImVec2 *points,int points_count,ImU32 col)

{
  uint uVar1;
  ImVec2 IVar2;
  ImDrawVert *pIVar3;
  ImVec2 IVar4;
  long lVar5;
  ImDrawIdx *pIVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ImDrawIdx IVar11;
  int iVar12;
  ImDrawIdx IVar13;
  ulong uVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  ulong local_68;
  ulong local_60;
  ImVec2 local_58;
  ulong local_50;
  undefined1 *local_48;
  float local_3c;
  ImU32 local_38;
  uint local_34;
  
  uVar10 = (ulong)(uint)points_count;
  IVar2 = this->_Data->TexUvWhitePixel;
  if ((this->Flags & 2) == 0) {
    uStack_80 = 0x1a511c;
    PrimReserve(this,points_count * 3 + -6,points_count);
    if (0 < points_count) {
      uVar8 = 0;
      do {
        this->_VtxWritePtr->pos = points[uVar8];
        this->_VtxWritePtr->uv = IVar2;
        pIVar3 = this->_VtxWritePtr;
        pIVar3->col = col;
        this->_VtxWritePtr = pIVar3 + 1;
        uVar8 = uVar8 + 1;
      } while (uVar10 != uVar8);
    }
    if (2 < points_count) {
      uVar1 = this->_VtxCurrentIdx;
      pIVar6 = this->_IdxWritePtr;
      iVar9 = points_count + -2;
      iVar12 = uVar1 + 2;
      do {
        *pIVar6 = (ImDrawIdx)uVar1;
        pIVar6[1] = (ImDrawIdx)iVar12 - 1;
        pIVar6[2] = (ImDrawIdx)iVar12;
        pIVar6 = pIVar6 + 3;
        iVar12 = iVar12 + 1;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
      this->_IdxWritePtr = pIVar6;
    }
    local_34 = points_count & 0xffff;
  }
  else {
    local_34 = points_count * 2;
    uStack_80 = 0x1a51a8;
    PrimReserve(this,points_count * 9 + -6,local_34);
    uVar1 = this->_VtxCurrentIdx;
    uVar8 = (ulong)uVar1;
    if (2 < points_count) {
      pIVar6 = this->_IdxWritePtr;
      iVar9 = points_count + -2;
      iVar12 = uVar1 + 2;
      do {
        *pIVar6 = (ImDrawIdx)uVar1;
        pIVar6[1] = (ImDrawIdx)iVar12;
        iVar12 = iVar12 + 2;
        pIVar6[2] = (ImDrawIdx)iVar12;
        pIVar6 = pIVar6 + 3;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
      this->_IdxWritePtr = pIVar6;
    }
    lVar5 = -((long)points_count * 8 + 0xfU & 0xfffffffffffffff0);
    local_48 = local_78 + lVar5;
    uVar14 = (ulong)(points_count - 1);
    local_68 = (ulong)(uint)points_count;
    local_58 = IVar2;
    local_50 = uVar10;
    local_38 = col;
    if (0 < points_count) {
      uVar10 = 0;
      uVar7 = uVar14;
      local_60 = uVar8;
      do {
        lVar15 = (long)(int)uVar7;
        local_78._0_4_ = points[uVar10].x - points[lVar15].x;
        local_3c = points[uVar10].y - points[lVar15].y;
        fVar16 = (float)local_78._0_4_ * (float)local_78._0_4_ + local_3c * local_3c;
        fVar17 = 1.0;
        if (0.0 < fVar16) {
          if (fVar16 < 0.0) {
            local_78 = ZEXT416((uint)local_78._0_4_);
            *(undefined8 *)(local_78 + lVar5 + -8) = 0x1a527f;
            fVar16 = sqrtf(fVar16);
            uVar8 = local_60;
          }
          else {
            fVar16 = SQRT(fVar16);
          }
          fVar17 = 1.0 / fVar16;
        }
        *(float *)(local_48 + lVar15 * 8) = local_3c * fVar17;
        *(float *)(local_48 + lVar15 * 8 + 4) = -(float)local_78._0_4_ * fVar17;
        uVar7 = uVar10 & 0xffffffff;
        uVar10 = uVar10 + 1;
      } while (local_68 != uVar10);
    }
    if (0 < (int)local_50) {
      uVar10 = 0;
      uVar7 = uVar8 & 0xffffffff;
      do {
        fVar16 = (*(float *)(local_48 + (long)(int)uVar14 * 8) + *(float *)(local_48 + uVar10 * 8))
                 * 0.5;
        fVar17 = (*(float *)(local_48 + (long)(int)uVar14 * 8 + 4) +
                 *(float *)(local_48 + uVar10 * 8 + 4)) * 0.5;
        fVar18 = fVar16 * fVar16 + fVar17 * fVar17;
        if (1e-06 < fVar18) {
          fVar18 = 1.0 / fVar18;
          fVar19 = 100.0;
          if (fVar18 <= 100.0) {
            fVar19 = fVar18;
          }
          fVar16 = fVar16 * fVar19;
          fVar17 = fVar17 * fVar19;
        }
        IVar4.y = points[uVar10].y - fVar17 * 0.5;
        IVar4.x = points[uVar10].x - fVar16 * 0.5;
        this->_VtxWritePtr->pos = IVar4;
        this->_VtxWritePtr->uv = local_58;
        pIVar3 = this->_VtxWritePtr;
        pIVar3->col = local_38;
        IVar2.y = fVar17 * 0.5 + points[uVar10].y;
        IVar2.x = fVar16 * 0.5 + points[uVar10].x;
        pIVar3[1].pos = IVar2;
        this->_VtxWritePtr[1].uv = local_58;
        pIVar3 = this->_VtxWritePtr;
        pIVar3[1].col = local_38 & 0xffffff;
        this->_VtxWritePtr = pIVar3 + 2;
        pIVar6 = this->_IdxWritePtr;
        IVar11 = (ImDrawIdx)uVar7;
        *pIVar6 = IVar11;
        pIVar6[1] = (short)uVar8 + (short)uVar14 * 2;
        IVar13 = (short)uVar8 + 1 + (short)uVar14 * 2;
        pIVar6[2] = IVar13;
        pIVar6[3] = IVar13;
        pIVar6[4] = IVar11 + 1;
        pIVar6[5] = IVar11;
        this->_IdxWritePtr = pIVar6 + 6;
        uVar14 = uVar10 & 0xffffffff;
        uVar10 = uVar10 + 1;
        uVar7 = (ulong)((int)uVar7 + 2);
      } while (local_68 != uVar10);
    }
    local_34 = local_34 & 0xfffe;
  }
  this->_VtxCurrentIdx = this->_VtxCurrentIdx + local_34;
  return;
}

Assistant:

void ImDrawList::AddConvexPolyFilled(const ImVec2* points, const int points_count, ImU32 col)
{
    const ImVec2 uv = _Data->TexUvWhitePixel;

    if (Flags & ImDrawListFlags_AntiAliasedFill)
    {
        // Anti-aliased Fill
        const float AA_SIZE = 1.0f;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;
        const int idx_count = (points_count-2)*3 + points_count*6;
        const int vtx_count = (points_count*2);
        PrimReserve(idx_count, vtx_count);

        // Add indexes for fill
        unsigned int vtx_inner_idx = _VtxCurrentIdx;
        unsigned int vtx_outer_idx = _VtxCurrentIdx+1;
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx+((i-1)<<1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_inner_idx+(i<<1));
            _IdxWritePtr += 3;
        }

        // Compute normals
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * sizeof(ImVec2));
        for (int i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            const ImVec2& p0 = points[i0];
            const ImVec2& p1 = points[i1];
            ImVec2 diff = p1 - p0;
            diff *= ImInvLength(diff, 1.0f);
            temp_normals[i0].x = diff.y;
            temp_normals[i0].y = -diff.x;
        }

        for (int i0 = points_count-1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            // Average normals
            const ImVec2& n0 = temp_normals[i0];
            const ImVec2& n1 = temp_normals[i1];
            ImVec2 dm = (n0 + n1) * 0.5f;
            float dmr2 = dm.x*dm.x + dm.y*dm.y;
            if (dmr2 > 0.000001f)
            {
                float scale = 1.0f / dmr2;
                if (scale > 100.0f) scale = 100.0f;
                dm *= scale;
            }
            dm *= AA_SIZE * 0.5f;

            // Add vertices
            _VtxWritePtr[0].pos = (points[i1] - dm); _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;        // Inner
            _VtxWritePtr[1].pos = (points[i1] + dm); _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;  // Outer
            _VtxWritePtr += 2;

            // Add indexes for fringes
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx+(i1<<1)); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx+(i0<<1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_outer_idx+(i0<<1));
            _IdxWritePtr[3] = (ImDrawIdx)(vtx_outer_idx+(i0<<1)); _IdxWritePtr[4] = (ImDrawIdx)(vtx_outer_idx+(i1<<1)); _IdxWritePtr[5] = (ImDrawIdx)(vtx_inner_idx+(i1<<1));
            _IdxWritePtr += 6;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Fill
        const int idx_count = (points_count-2)*3;
        const int vtx_count = points_count;
        PrimReserve(idx_count, vtx_count);
        for (int i = 0; i < vtx_count; i++)
        {
            _VtxWritePtr[0].pos = points[i]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr++;
        }
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx+i-1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx+i);
            _IdxWritePtr += 3;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
}